

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<Fad<double>,_10>::TPZManVector
          (TPZManVector<Fad<double>,_10> *this,int64_t size,Fad<double> *copy)

{
  int64_t *piVar1;
  int64_t iVar2;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  Vector<double> *this_00;
  long lVar5;
  
  (this->super_TPZVec<Fad<double>_>).fStore = (Fad<double> *)0x0;
  (this->super_TPZVec<Fad<double>_>).fNElements = 0;
  (this->super_TPZVec<Fad<double>_>).fNAlloc = 0;
  (this->super_TPZVec<Fad<double>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01889648;
  pFVar4 = this->fExtAlloc;
  lVar5 = 0;
  pFVar3 = pFVar4;
  do {
    Fad<double>::Fad(pFVar3);
    lVar5 = lVar5 + -0x20;
    pFVar3 = pFVar3 + 1;
  } while (lVar5 != -0x140);
  if (size < 0xb) {
    iVar2 = 0;
  }
  else {
    piVar1 = (int64_t *)operator_new__(-(ulong)((ulong)size >> 0x3b != 0) | size * 0x20 | 8);
    *piVar1 = size;
    pFVar4 = (Fad<double> *)(piVar1 + 1);
    lVar5 = 0;
    pFVar3 = pFVar4;
    do {
      Fad<double>::Fad(pFVar3);
      lVar5 = lVar5 + -0x20;
      pFVar3 = pFVar3 + 1;
      iVar2 = size;
    } while (-lVar5 != size * 0x20);
  }
  (this->super_TPZVec<Fad<double>_>).fStore = pFVar4;
  (this->super_TPZVec<Fad<double>_>).fNElements = size;
  (this->super_TPZVec<Fad<double>_>).fNAlloc = iVar2;
  if (0 < size) {
    lVar5 = 0;
    do {
      pFVar4 = (this->super_TPZVec<Fad<double>_>).fStore;
      this_00 = (Vector<double> *)((long)&(pFVar4->dx_).num_elts + lVar5);
      this_00[-1].ptr_to_data = (double *)copy->val_;
      Vector<double>::operator=(this_00,&copy->dx_);
      *(double *)((long)&pFVar4->defaultVal + lVar5) = copy->defaultVal;
      lVar5 = lVar5 + 0x20;
      size = size + -1;
    } while (size != 0);
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size, const T& copy) :
TPZVec<T>(0)
//fNExtAlloc( NumExtAlloc ) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy;
    }
}